

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_util.c
# Opt level: O0

attr_list CMint_add_ref_attr_list(CManager cm,attr_list l,char *file,int line)

{
  FILE *__stream;
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  uint in_ECX;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  CManager unaff_retaddr;
  timespec ts;
  int count;
  timespec local_38;
  int local_28;
  uint local_24;
  undefined8 local_20;
  long local_18;
  long local_10;
  undefined8 in_stack_fffffffffffffff8;
  CMTraceType trace_type;
  attr_list p_Var4;
  
  trace_type = (CMTraceType)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  if (in_RSI == 0) {
    p_Var4 = (attr_list)0x0;
  }
  else {
    local_24 = in_ECX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_28 = attr_list_ref_count(in_RSI);
    iVar1 = CMtrace_val[8];
    if (*(long *)(local_10 + 0x120) == 0) {
      iVar1 = CMtrace_init(unaff_retaddr,trace_type);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        __stream = *(FILE **)(local_10 + 0x120);
        _Var2 = getpid();
        pVar3 = pthread_self();
        fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar3);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_38);
        fprintf(*(FILE **)(local_10 + 0x120),"%lld.%.9ld - ",local_38.tv_sec,local_38.tv_nsec);
      }
      fprintf(*(FILE **)(local_10 + 0x120),"Adding ref attr list %p at %s:%d, ref count now %d\n",
              local_18,local_20,(ulong)local_24,(ulong)(local_28 + 1));
    }
    fflush(*(FILE **)(local_10 + 0x120));
    p_Var4 = (attr_list)add_ref_attr_list(local_18);
  }
  return p_Var4;
}

Assistant:

extern attr_list 
CMint_add_ref_attr_list(CManager cm, attr_list l, char *file, int line)
{
    int count;
    (void)cm;
    if (l == NULL) return NULL;
    count = attr_list_ref_count(l);
    CMtrace_out(cm, CMAttrVerbose, "Adding ref attr list %p at %s:%d, ref count now %d\n", 
		l, file, line, count+1);
    return add_ref_attr_list(l);
}